

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TablePushBackgroundChannel(void)

{
  ImGuiWindow *window_00;
  ImGuiTable *pIVar1;
  ImGuiTable *table;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  window_00 = GImGui->CurrentWindow;
  pIVar1 = GImGui->CurrentTable;
  (pIVar1->HostBackupInnerClipRect).Min = (window_00->ClipRect).Min;
  (pIVar1->HostBackupInnerClipRect).Max = (window_00->ClipRect).Max;
  SetWindowClipRectBeforeSetChannel(window_00,&pIVar1->Bg2ClipRectForDrawCmd);
  ImDrawListSplitter::SetCurrentChannel
            (pIVar1->DrawSplitter,window_00->DrawList,(uint)pIVar1->Bg2DrawChannelCurrent);
  return;
}

Assistant:

void ImGui::TablePushBackgroundChannel()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiTable* table = g.CurrentTable;

    // Optimization: avoid SetCurrentChannel() + PushClipRect()
    table->HostBackupInnerClipRect = window->ClipRect;
    SetWindowClipRectBeforeSetChannel(window, table->Bg2ClipRectForDrawCmd);
    table->DrawSplitter->SetCurrentChannel(window->DrawList, table->Bg2DrawChannelCurrent);
}